

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O2

void __thiscall QMenuBar::mousePressEvent(QMenuBar *this,QMouseEvent *e)

{
  QMenuBarPrivate *this_00;
  Data *pDVar1;
  QWidget *this_01;
  bool bVar2;
  char cVar3;
  QPoint p;
  QAction *action;
  QObject *pQVar4;
  long in_FS_OFFSET;
  QPoint local_40;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(e + 0x40) == 1) {
    this_00 = *(QMenuBarPrivate **)&(this->super_QWidget).field_0x8;
    this_00->field_0x298 = this_00->field_0x298 | 1;
    local_38 = QSinglePointEvent::position((QSinglePointEvent *)e);
    p = QPointF::toPoint(&local_38);
    action = QMenuBarPrivate::actionAt(this_00,p);
    if (action != (QAction *)0x0) {
      bVar2 = QMenuBarPrivate::isVisible(this_00,action);
      if (bVar2) {
        cVar3 = QAction::isEnabled();
        if (cVar3 != '\0') {
          pDVar1 = (this_00->currentAction).wp.d;
          if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
            pQVar4 = (QObject *)0x0;
          }
          else {
            pQVar4 = (this_00->currentAction).wp.value;
          }
          if ((pQVar4 == (QObject *)action) && ((this_00->field_0x2a0 & 1) != 0)) {
            pDVar1 = (this_00->activeMenu).wp.d;
            if ((pDVar1 != (Data *)0x0) &&
               ((*(int *)(pDVar1 + 4) != 0 &&
                (this_01 = (QWidget *)(this_00->activeMenu).wp.value, this_01 != (QWidget *)0x0))))
            {
              QWeakPointer<QObject>::assign<QObject>(&(this_00->activeMenu).wp,(QObject *)0x0);
              QWidget::setAttribute(this_01,WA_NoMouseReplay,true);
              QWidget::hide(this_01);
            }
          }
          else {
            QMenuBarPrivate::setCurrentAction(this_00,action,true,false);
          }
          goto LAB_0042d569;
        }
      }
    }
    QMenuBarPrivate::setCurrentAction(this_00,(QAction *)0x0,false,false);
    bVar2 = QWhatsThis::inWhatsThisMode();
    if (bVar2) {
      local_38 = QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
      local_40 = QPointF::toPoint(&local_38);
      QWhatsThis::showText
                (&local_40,&(this_00->super_QWidgetPrivate).whatsThis,&this->super_QWidget);
    }
  }
LAB_0042d569:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuBar::mousePressEvent(QMouseEvent *e)
{
    Q_D(QMenuBar);
    if (e->button() != Qt::LeftButton)
        return;

    d->mouseDown = true;

    QAction *action = d->actionAt(e->position().toPoint());
    if (!action || !d->isVisible(action) || !action->isEnabled()) {
        d->setCurrentAction(nullptr);
#if QT_CONFIG(whatsthis)
        if (QWhatsThis::inWhatsThisMode())
            QWhatsThis::showText(e->globalPosition().toPoint(), d->whatsThis, this);
#endif
        return;
    }

    if (d->currentAction == action && d->popupState) {
        if (QMenu *menu = d->activeMenu) {
            d->activeMenu = nullptr;
            menu->setAttribute(Qt::WA_NoMouseReplay);
            menu->hide();
        }
    } else {
        d->setCurrentAction(action, true);
    }
}